

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O3

bool __thiscall
sptk::CepstrumToAutocorrelation::Run
          (CepstrumToAutocorrelation *this,vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  double *pdVar5;
  bool bVar6;
  size_t __n;
  pointer pdVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  int local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if ((buffer != (Buffer *)0x0) &&
     (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar1 = this->num_input_order_;
    lVar8 = (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (lVar8 == (long)iVar1 + 1) {
      iVar2 = this->num_output_order_;
      __new_size = (long)iVar2 + 1;
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
      }
      iVar3 = (this->fast_fourier_transform_).fft_length_;
      this_00 = &buffer->real_part_;
      pdVar7 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar7 >> 3 != (long)iVar3) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar3);
        pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pdVar4 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4;
      if (__n != 0) {
        memmove(pdVar7,pdVar4,__n);
        pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pdVar4 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar7 + lVar8 != pdVar4) {
        memset(pdVar7 + lVar8,0,
               ((long)pdVar4 + (-0x10 - (long)(pdVar7 + iVar1)) & 0xfffffffffffffff8U) + 8);
      }
      bVar6 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar6) {
        pdVar5 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar9 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start; pdVar9 != pdVar5;
            pdVar9 = pdVar9 + 1) {
          dVar10 = exp(*pdVar9 + *pdVar9);
          *pdVar9 = dVar10;
        }
        bVar6 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                           &buffer->buffer_for_fast_fourier_transform_);
        if (bVar6) {
          local_48 = (int)__new_size;
          if (local_48 != 0) {
            pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar8 = 0;
            do {
              *(double *)((long)pdVar4 + lVar8) =
                   *(double *)((long)pdVar7 + lVar8) * (1.0 / (double)iVar3);
              lVar8 = lVar8 + 8;
            } while ((long)iVar2 * 8 + 8 != lVar8);
            return true;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CepstrumToAutocorrelation::Run(
    const std::vector<double>& cepstrum, std::vector<double>* autocorrelation,
    CepstrumToAutocorrelation::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ || cepstrum.size() != static_cast<std::size_t>(input_length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (autocorrelation->size() != static_cast<std::size_t>(output_length)) {
    autocorrelation->resize(output_length);
  }
  const int fft_length(fast_fourier_transform_.GetFftLength());
  if (buffer->real_part_.size() != static_cast<std::size_t>(fft_length)) {
    buffer->real_part_.resize(fft_length);
  }

  std::copy(cepstrum.begin(), cepstrum.end(), buffer->real_part_.begin());
  std::fill(buffer->real_part_.begin() + input_length, buffer->real_part_.end(),
            0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  std::transform(buffer->real_part_.begin(), buffer->real_part_.end(),
                 buffer->real_part_.begin(),
                 [](double x) { return std::exp(2.0 * x); });

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  const double z(1.0 / fft_length);
  std::transform(buffer->real_part_.begin(),
                 buffer->real_part_.begin() + output_length,
                 autocorrelation->begin(), [z](double x) { return x * z; });

  return true;
}